

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

bool __thiscall
re2::RE2::Rewrite(RE2 *this,string *out,StringPiece *rewrite,StringPiece *vec,int veclen)

{
  uint uVar1;
  size_type sVar2;
  char __c;
  ostream *poVar3;
  size_t sVar4;
  int iVar5;
  bool bVar6;
  char *pcVar7;
  char *pcVar8;
  LogMessage local_1b0;
  
  sVar2 = rewrite->size_;
  bVar6 = (long)sVar2 < 1;
  if (0 < (long)sVar2) {
    pcVar7 = rewrite->data_;
    pcVar8 = pcVar7 + sVar2;
    do {
      __c = *pcVar7;
      if (__c == '\\') {
        pcVar7 = pcVar7 + 1;
        iVar5 = -1;
        if (pcVar7 < pcVar8) {
          iVar5 = (int)*pcVar7;
        }
        uVar1 = iVar5 - 0x30;
        if (9 < uVar1) {
          __c = '\\';
          if (iVar5 != 0x5c) {
            if ((this->options_).log_errors_ != true) {
              return bVar6;
            }
            LogMessage::LogMessage
                      (&local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/re2.cc"
                       ,0x423);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1b0.str_,"invalid rewrite pattern: ",0x19);
            pcVar7 = rewrite->data_;
            if (pcVar7 == (char *)0x0) {
              std::ios::clear((int)&local_1b0 + 8 +
                              (int)local_1b0.str_.super_basic_ostream<char,_std::char_traits<char>_>
                                   ._vptr_basic_ostream[-3]);
            }
            else {
              sVar4 = strlen(pcVar7);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0.str_,pcVar7,sVar4);
            }
            LogMessage::~LogMessage(&local_1b0);
            return bVar6;
          }
          goto LAB_00242270;
        }
        if ((int)uVar1 < veclen) {
          if (vec[uVar1].size_ != 0) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            append(out,vec[uVar1].data_,vec[uVar1].size_);
          }
        }
        else if ((this->options_).log_errors_ == true) {
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/re2.cc"
                     ,0x417);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0.str_,"invalid substitution \\",0x16);
          poVar3 = (ostream *)std::ostream::operator<<(&local_1b0.str_,uVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," from ",6);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,veclen);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," groups",7);
          LogMessage::~LogMessage(&local_1b0);
        }
        if (veclen <= (int)uVar1) {
          return bVar6;
        }
      }
      else {
LAB_00242270:
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(out,__c);
      }
      pcVar7 = pcVar7 + 1;
      bVar6 = pcVar7 >= pcVar8;
    } while (pcVar7 < pcVar8);
  }
  return bVar6;
}

Assistant:

bool RE2::Rewrite(std::string* out,
                  const StringPiece& rewrite,
                  const StringPiece* vec,
                  int veclen) const {
  for (const char *s = rewrite.data(), *end = s + rewrite.size();
       s < end; s++) {
    if (*s != '\\') {
      out->push_back(*s);
      continue;
    }
    s++;
    int c = (s < end) ? *s : -1;
    if (isdigit(c)) {
      int n = (c - '0');
      if (n >= veclen) {
        if (options_.log_errors()) {
          LOG(ERROR) << "invalid substitution \\" << n
                     << " from " << veclen << " groups";
        }
        return false;
      }
      StringPiece snip = vec[n];
      if (!snip.empty())
        out->append(snip.data(), snip.size());
    } else if (c == '\\') {
      out->push_back('\\');
    } else {
      if (options_.log_errors())
        LOG(ERROR) << "invalid rewrite pattern: " << rewrite.data();
      return false;
    }
  }
  return true;
}